

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall BasicBlock::CleanUpValueMaps(BasicBlock *this)

{
  GlobOptBlockData *this_00;
  ExprHash EVar1;
  int iVar2;
  GlobOpt *pGVar3;
  JitArenaAllocator *pJVar4;
  ValueHashTable<Sym_*,_Value_*> *this_01;
  Loop *pLVar5;
  BVSparse<Memory::JitArenaAllocator> *obj;
  BVSparse<Memory::JitArenaAllocator> *obj_00;
  Value *pVVar6;
  Sym *pSVar7;
  ValueInfo *this_02;
  ExprHashTable *pEVar8;
  long lVar9;
  code *pcVar10;
  byte bVar11;
  uint uVar12;
  bool bVar13;
  BOOLEAN BVar14;
  bool bVar15;
  undefined4 *puVar16;
  Type *ppOVar17;
  StackSym *pSVar18;
  Type *pTVar19;
  Type *pTVar20;
  Value *pVVar21;
  Sym *pSVar22;
  ulong uVar23;
  BVSparse<Memory::JitArenaAllocator> *bv2;
  Type_conflict pBVar24;
  uint uVar25;
  uint uVar26;
  uint key;
  undefined1 auStack_128 [8];
  BVSparse<Memory::JitArenaAllocator> symsInCallSequence;
  BVSparse<Memory::JitArenaAllocator> keepAliveSymsBv;
  BVSparse<Memory::JitArenaAllocator> availableValueNumbers;
  long *local_a0;
  undefined1 auStack_88 [8];
  BVSparse<Memory::JitArenaAllocator> deadSymsBv;
  undefined1 auStack_58 [8];
  EditingIterator iter;
  
  uVar26 = DAT_0143bff8;
  uVar12 = DAT_0143bff4;
  uVar25 = *(uint *)&((this->globOptData).globOpt)->field_0xf4;
  bVar13 = IsLandingPad(this);
  pGVar3 = (this->globOptData).globOpt;
  if (!bVar13) {
    if ((uVar25 >> 0x19 & 1) == 0) {
      uVar26 = uVar12;
    }
    if (pGVar3->instrCountSinceLastCleanUp < uVar26) {
      return;
    }
  }
  this_00 = &this->globOptData;
  pGVar3->instrCountSinceLastCleanUp = 0;
  pJVar4 = pGVar3->tempAlloc;
  this_01 = this_00->symToValueMap;
  deadSymsBv.alloc = (Type)auStack_88;
  auStack_88 = (undefined1  [8])0x0;
  deadSymsBv.head = (Type_conflict)0x0;
  keepAliveSymsBv.alloc = (Type)&symsInCallSequence.lastUsedNodePrevNextField;
  symsInCallSequence.lastUsedNodePrevNextField = (Type)0x0;
  keepAliveSymsBv.head = (Type_conflict)0x0;
  keepAliveSymsBv.lastUsedNodePrevNextField = (Type)0x0;
  keepAliveSymsBv.lastFoundIndex = (Type_conflict)pJVar4;
  deadSymsBv.lastFoundIndex = (Type_conflict)pJVar4;
  BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
            ((BVSparse<Memory::JitArenaAllocator> *)&keepAliveSymsBv.lastUsedNodePrevNextField,
             pGVar3->byteCodeConstantValueNumbersBv);
  pLVar5 = this->loop;
  obj = this->upwardExposedUses;
  obj_00 = this->upwardExposedFields;
  symsInCallSequence.alloc = (Type)auStack_128;
  auStack_128 = (undefined1  [8])0x0;
  symsInCallSequence.head = (Type_conflict)0x0;
  pBVar24 = (Type_conflict)(this->globOptData).callSequence;
  symsInCallSequence.lastFoundIndex = (Type_conflict)pJVar4;
  if ((pBVar24 != (Type_conflict)0x0) &&
     ((Type_conflict)((SListNodeBase<Memory::ArenaAllocator> *)&pBVar24->next)->next != pBVar24)) {
    auStack_58 = (undefined1  [8])pBVar24;
    iter.super_Iterator.list =
         (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)pBVar24;
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while( true ) {
      if (pBVar24 == (Type_conflict)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar16 = 1;
        bVar13 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                            ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar13) goto LAB_003ff213;
        *puVar16 = 0;
        pBVar24 = (Type_conflict)iter.super_Iterator.list;
      }
      pBVar24 = (Type_conflict)((SListNodeBase<Memory::ArenaAllocator> *)&pBVar24->next)->next;
      if ((undefined1  [8])pBVar24 == auStack_58) break;
      iter.super_Iterator.list =
           (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)pBVar24;
      ppOVar17 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)auStack_58);
      pSVar18 = IR::Opnd::GetStackSym(*ppOVar17);
      BVSparse<Memory::JitArenaAllocator>::Set
                ((BVSparse<Memory::JitArenaAllocator> *)auStack_128,(pSVar18->super_Sym).m_id);
      pBVar24 = (Type_conflict)iter.super_Iterator.list;
    }
  }
  for (uVar23 = 0; uVar23 < this_01->tableSize; uVar23 = uVar23 + 1) {
    auStack_58 = (undefined1  [8])(this_01->table + uVar23);
    iter.super_Iterator.current = (NodeBase *)0x0;
    iter.super_Iterator.list =
         (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)auStack_58;
LAB_003fe9f8:
    bVar13 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
             EditingIterator::Next((EditingIterator *)auStack_58);
    if (bVar13) {
      pTVar19 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator::
                Data((Iterator *)auStack_58);
      pSVar22 = pTVar19->value;
      BVar14 = BVSparse<Memory::JitArenaAllocator>::Test(obj,pSVar22->m_id);
      bVar11 = 1;
      if ((BVar14 == '\0') &&
         (BVar14 = BVSparse<Memory::JitArenaAllocator>::Test(obj_00,pSVar22->m_id), BVar14 == '\0'))
      goto LAB_003febd4;
      goto LAB_003fea45;
    }
  }
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_88,
             (BVSparse<Memory::JitArenaAllocator> *)&symsInCallSequence.lastUsedNodePrevNextField);
  pEVar8 = (this->globOptData).exprToValueMap;
  bVar13 = (this->globOptData).hasCSECandidates;
  (this->globOptData).hasCSECandidates = false;
  local_a0 = (long *)auStack_88;
  for (uVar23 = 0; uVar23 < pEVar8->tableSize; uVar23 = uVar23 + 1) {
    auStack_58 = (undefined1  [8])(pEVar8->table + uVar23);
    iter.super_Iterator.current = (NodeBase *)0x0;
    iter.super_Iterator.list =
         (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)auStack_58;
    while (bVar15 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                    EditingIterator::Next((EditingIterator *)auStack_58), bVar15) {
      pTVar20 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                Iterator::Data((Iterator *)auStack_58);
      EVar1 = pTVar20->value;
      uVar25 = (uint)EVar1 >> 8 & 0x7ff;
      if (((((uVar25 == 0) ||
            (BVar14 = BVSparse<Memory::JitArenaAllocator>::Test
                                ((BVSparse<Memory::JitArenaAllocator> *)
                                 &keepAliveSymsBv.lastUsedNodePrevNextField,uVar25), BVar14 != '\0')
            ) && ((uVar25 = (uint)EVar1 >> 0x13 & 0x7ff, uVar25 == 0 ||
                  (BVar14 = BVSparse<Memory::JitArenaAllocator>::Test
                                      ((BVSparse<Memory::JitArenaAllocator> *)
                                       &keepAliveSymsBv.lastUsedNodePrevNextField,uVar25),
                  BVar14 != '\0')))) &&
          ((pVVar6 = pTVar20->element, pVVar6 != (Value *)0x0 &&
           (pSVar22 = pVVar6->valueInfo->symStore, pSVar22 != (Sym *)0x0)))) &&
         ((pVVar21 = GlobOptBlockData::FindValue(this_00,pSVar22), pVVar21 != (Value *)0x0 &&
          (pVVar21->valueNumber == pVVar6->valueNumber)))) {
        BVSparse<Memory::JitArenaAllocator>::Clear
                  ((BVSparse<Memory::JitArenaAllocator> *)auStack_88,pSVar22->m_id);
        if (pSVar22->m_kind == SymKindStack) {
          pSVar18 = Sym::AsStackSym(pSVar22);
          bVar15 = StackSym::HasObjectTypeSym(pSVar18);
          if (bVar15) {
            pSVar18 = Sym::AsStackSym(pSVar22);
            pSVar18 = StackSym::GetObjectTypeSym(pSVar18);
            BVSparse<Memory::JitArenaAllocator>::Clear
                      ((BVSparse<Memory::JitArenaAllocator> *)auStack_88,(pSVar18->super_Sym).m_id);
          }
        }
        (this->globOptData).hasCSECandidates = bVar13;
      }
      else {
        SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::EditingIterator
        ::RemoveCurrent((EditingIterator *)auStack_58,&pEVar8->alloc->super_ArenaAllocator);
      }
    }
  }
  while (local_a0 = (long *)*local_a0, local_a0 != (long *)0x0) {
    iVar2 = *(int *)(local_a0 + 1);
    auStack_58 = (undefined1  [8])local_a0[2];
    while (auStack_58 != (undefined1  [8])0x0) {
      lVar9 = 0;
      if (auStack_58 != (undefined1  [8])0x0) {
        for (; ((ulong)auStack_58 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
        }
      }
      BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)auStack_58,(BVIndex)lVar9);
      key = (BVIndex)lVar9 + iVar2;
      ValueHashTable<Sym_*,_Value_*>::Clear(this_01,key);
      pSVar22 = SymTable::Find(this->func->m_symTable,key);
      GlobOptBlockData::SetChangedSym(this_00,pSVar22);
    }
  }
  bVar13 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                     ((BVSparse<Memory::JitArenaAllocator> *)auStack_88);
  if (!bVar13) {
    bVar13 = Func::IsJitInDebugMode(this->func);
    if (bVar13) {
      bv2 = this->func->m_nonTempLocalVars;
      if (bv2 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar16 = 1;
        bVar13 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                            ,0x1133,"(this->func->m_nonTempLocalVars)",
                            "this->func->m_nonTempLocalVars");
        if (!bVar13) goto LAB_003ff213;
        *puVar16 = 0;
        bv2 = this->func->m_nonTempLocalVars;
      }
      auStack_58 = (undefined1  [8])0x0;
      iter.super_Iterator.list =
           (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0;
      iter.super_Iterator.current = (NodeBase *)pJVar4;
      iter.last = (NodeBase *)auStack_58;
      BVSparse<Memory::JitArenaAllocator>::Minus
                ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,
                 (BVSparse<Memory::JitArenaAllocator> *)auStack_88,bv2);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                ((this->globOptData).liveVarSyms,(BVSparse<Memory::JitArenaAllocator> *)auStack_58);
      BVSparse<Memory::JitArenaAllocator>::And
                ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,(this->globOptData).liveInt32Syms
                 ,this->func->m_nonTempLocalVars);
      bVar13 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                         ((BVSparse<Memory::JitArenaAllocator> *)auStack_58);
      if (!bVar13) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar16 = 1;
        bVar13 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                            ,0x1139,"(tempBv.IsEmpty())",
                            "Type spec is disabled under debugger. How come did we get a non-temp local in liveInt32Syms?"
                           );
        if (!bVar13) goto LAB_003ff213;
        *puVar16 = 0;
      }
      BVSparse<Memory::JitArenaAllocator>::And
                ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,
                 (this->globOptData).liveLossyInt32Syms,this->func->m_nonTempLocalVars);
      bVar13 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                         ((BVSparse<Memory::JitArenaAllocator> *)auStack_58);
      if (!bVar13) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar16 = 1;
        bVar13 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                            ,0x113b,"(tempBv.IsEmpty())",
                            "Type spec is disabled under debugger. How come did we get a non-temp local in liveLossyInt32Syms?"
                           );
        if (!bVar13) goto LAB_003ff213;
        *puVar16 = 0;
      }
      BVSparse<Memory::JitArenaAllocator>::And
                ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,
                 (this->globOptData).liveFloat64Syms,this->func->m_nonTempLocalVars);
      bVar13 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                         ((BVSparse<Memory::JitArenaAllocator> *)auStack_58);
      if (!bVar13) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar16 = 1;
        bVar13 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                            ,0x113d,"(tempBv.IsEmpty())",
                            "Type spec is disabled under debugger. How come did we get a non-temp local in liveFloat64Syms?"
                           );
        if (!bVar13) {
LAB_003ff213:
          pcVar10 = (code *)invalidInstructionException();
          (*pcVar10)();
        }
        *puVar16 = 0;
      }
      BVSparse<Memory::JitArenaAllocator>::~BVSparse
                ((BVSparse<Memory::JitArenaAllocator> *)auStack_58);
    }
    else {
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                ((this->globOptData).liveVarSyms,(BVSparse<Memory::JitArenaAllocator> *)auStack_88);
    }
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              ((this->globOptData).liveInt32Syms,(BVSparse<Memory::JitArenaAllocator> *)auStack_88);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              ((this->globOptData).liveLossyInt32Syms,
               (BVSparse<Memory::JitArenaAllocator> *)auStack_88);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              ((this->globOptData).liveFloat64Syms,(BVSparse<Memory::JitArenaAllocator> *)auStack_88
              );
  }
  Memory::
  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
            (((this->globOptData).globOpt)->alloc,obj);
  this->upwardExposedUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  Memory::
  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
            (((this->globOptData).globOpt)->alloc,obj_00);
  this->upwardExposedFields = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  if (this->cloneStrCandidates != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (((this->globOptData).globOpt)->alloc,this->cloneStrCandidates);
    this->cloneStrCandidates = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  BVSparse<Memory::JitArenaAllocator>::~BVSparse((BVSparse<Memory::JitArenaAllocator> *)auStack_128)
  ;
  BVSparse<Memory::JitArenaAllocator>::~BVSparse
            ((BVSparse<Memory::JitArenaAllocator> *)&keepAliveSymsBv.lastUsedNodePrevNextField);
  BVSparse<Memory::JitArenaAllocator>::~BVSparse
            ((BVSparse<Memory::JitArenaAllocator> *)&symsInCallSequence.lastUsedNodePrevNextField);
  BVSparse<Memory::JitArenaAllocator>::~BVSparse((BVSparse<Memory::JitArenaAllocator> *)auStack_88);
  return;
LAB_003febd4:
  BVar14 = BVSparse<Memory::JitArenaAllocator>::Test
                     ((BVSparse<Memory::JitArenaAllocator> *)auStack_128,pSVar22->m_id);
  if (BVar14 == '\0') {
    bVar11 = 0;
LAB_003fea45:
    if (pLVar5 == (Loop *)0x0) {
      bVar13 = false;
    }
    else {
      BVar14 = BVSparse<Memory::JitArenaAllocator>::Test
                         (this->loop->fieldPRESymStores,pSVar22->m_id);
      bVar13 = BVar14 != '\0';
    }
    pGVar3 = (this->globOptData).globOpt;
    if (((bVar13) || ((bool)(bVar11 | pGVar3->maxInitialSymID < pSVar22->m_id))) ||
       ((pLVar5 != (Loop *)0x0 &&
        (BVar14 = BVSparse<Memory::JitArenaAllocator>::Test
                            (pGVar3->prePassCopyPropSym,pSVar22->m_id), BVar14 != '\0')))) {
      if ((pSVar22->m_kind == SymKindProperty) &&
         (BVar14 = BVSparse<Memory::JitArenaAllocator>::Test
                             ((this->globOptData).liveFields,pSVar22->m_id), BVar14 == '\0')) {
        SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
        RemoveCurrent((EditingIterator *)auStack_58,&this_01->alloc->super_ArenaAllocator);
        BVSparse<Memory::JitArenaAllocator>::Clear((this->globOptData).liveInt32Syms,pSVar22->m_id);
        BVSparse<Memory::JitArenaAllocator>::Clear
                  ((this->globOptData).liveLossyInt32Syms,pSVar22->m_id);
        BVSparse<Memory::JitArenaAllocator>::Clear
                  ((this->globOptData).liveFloat64Syms,pSVar22->m_id);
      }
      else {
        pVVar6 = pTVar19->element;
        pSVar7 = pVVar6->valueInfo->symStore;
        if ((pSVar7 != pSVar22 && pSVar7 != (Sym *)0x0) &&
           (BVSparse<Memory::JitArenaAllocator>::Set
                      ((BVSparse<Memory::JitArenaAllocator> *)
                       &symsInCallSequence.lastUsedNodePrevNextField,pSVar7->m_id),
           pSVar7->m_kind == SymKindStack)) {
          pSVar18 = Sym::AsStackSym(pSVar7);
          bVar13 = StackSym::HasObjectTypeSym(pSVar18);
          if (bVar13) {
            pSVar18 = Sym::AsStackSym(pSVar7);
            pSVar18 = StackSym::GetObjectTypeSym(pSVar18);
            BVSparse<Memory::JitArenaAllocator>::Set
                      ((BVSparse<Memory::JitArenaAllocator> *)
                       &symsInCallSequence.lastUsedNodePrevNextField,(pSVar18->super_Sym).m_id);
          }
        }
        BVSparse<Memory::JitArenaAllocator>::Set
                  ((BVSparse<Memory::JitArenaAllocator> *)&keepAliveSymsBv.lastUsedNodePrevNextField
                   ,pVVar6->valueNumber);
      }
    }
    else {
      pVVar6 = pTVar19->element;
      this_02 = pVVar6->valueInfo;
      pSVar7 = this_02->symStore;
      if (pSVar7 == pSVar22 && pSVar7 != (Sym *)0x0) {
        bVar13 = ValueInfo::IsVarConstant(this_02);
        if (((!bVar13) &&
            (bVar13 = ValueInfo::HasIntConstantValue(pTVar19->element->valueInfo,false), !bVar13))
           && (BVSparse<Memory::JitArenaAllocator>::Set
                         ((BVSparse<Memory::JitArenaAllocator> *)auStack_88,pSVar22->m_id),
              pSVar22->m_kind == SymKindStack)) {
          pSVar18 = Sym::AsStackSym(pSVar22);
          bVar13 = StackSym::HasObjectTypeSym(pSVar18);
          if (bVar13) {
            pSVar18 = Sym::AsStackSym(pSVar22);
            pSVar18 = StackSym::GetObjectTypeSym(pSVar18);
            BVSparse<Memory::JitArenaAllocator>::Set
                      ((BVSparse<Memory::JitArenaAllocator> *)auStack_88,(pSVar18->super_Sym).m_id);
          }
        }
        BVSparse<Memory::JitArenaAllocator>::Set
                  ((BVSparse<Memory::JitArenaAllocator> *)&keepAliveSymsBv.lastUsedNodePrevNextField
                   ,pVVar6->valueNumber);
      }
      else {
        if (pSVar22->m_kind == SymKindStack) {
          pSVar18 = Sym::AsStackSym(pSVar22);
          bVar13 = StackSym::HasObjectTypeSym(pSVar18);
          if (bVar13) {
            pSVar18 = Sym::AsStackSym(pSVar22);
            pSVar18 = StackSym::GetObjectTypeSym(pSVar18);
            BVSparse<Memory::JitArenaAllocator>::Set
                      ((BVSparse<Memory::JitArenaAllocator> *)auStack_88,(pSVar18->super_Sym).m_id);
          }
        }
        SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
        RemoveCurrent((EditingIterator *)auStack_58,&this_01->alloc->super_ArenaAllocator);
        BVSparse<Memory::JitArenaAllocator>::Clear((this->globOptData).liveInt32Syms,pSVar22->m_id);
        BVSparse<Memory::JitArenaAllocator>::Clear
                  ((this->globOptData).liveLossyInt32Syms,pSVar22->m_id);
        BVSparse<Memory::JitArenaAllocator>::Clear
                  ((this->globOptData).liveFloat64Syms,pSVar22->m_id);
        GlobOptBlockData::SetChangedSym(this_00,pSVar22);
      }
    }
  }
  goto LAB_003fe9f8;
}

Assistant:

void
BasicBlock::CleanUpValueMaps()
{
    // Don't do cleanup if it's been done recently.
    // Landing pad could get optimized twice...
    // We want the same info out the first and second time. So always cleanup.
    // Increasing the cleanup threshold count for asmjs to 500
    uint cleanupCount = (!this->globOptData.globOpt->GetIsAsmJSFunc()) ? CONFIG_FLAG(GoptCleanupThreshold) : CONFIG_FLAG(AsmGoptCleanupThreshold);
    if (!this->IsLandingPad() && this->globOptData.globOpt->instrCountSinceLastCleanUp < cleanupCount)
    {
        return;
    }
    this->globOptData.globOpt->instrCountSinceLastCleanUp = 0;

    JitArenaAllocator* tempAlloc = this->globOptData.globOpt->tempAlloc;

    GlobHashTable *thisTable = this->globOptData.symToValueMap;
    BVSparse<JitArenaAllocator> deadSymsBv(tempAlloc);
    BVSparse<JitArenaAllocator> keepAliveSymsBv(tempAlloc);
    BVSparse<JitArenaAllocator> availableValueNumbers(tempAlloc);
    availableValueNumbers.Copy(this->globOptData.globOpt->byteCodeConstantValueNumbersBv);
    BVSparse<JitArenaAllocator> *upwardExposedUses = this->upwardExposedUses;
    BVSparse<JitArenaAllocator> *upwardExposedFields = this->upwardExposedFields;
    bool isInLoop = !!this->loop;

    BVSparse<JitArenaAllocator> symsInCallSequence(tempAlloc);
    SListBase<IR::Opnd *> * callSequence = this->globOptData.callSequence;
    if (callSequence && !callSequence->Empty())
    {
        FOREACH_SLISTBASE_ENTRY(IR::Opnd *, opnd, callSequence)
        {
            StackSym * sym = opnd->GetStackSym();
            symsInCallSequence.Set(sym->m_id);
        }
    }
    NEXT_SLISTBASE_ENTRY;

    for (uint i = 0; i < thisTable->tableSize; i++)
    {
        FOREACH_SLISTBASE_ENTRY_EDITING(GlobHashBucket, bucket, &thisTable->table[i], iter)
        {
            Sym * sym = bucket.value;
            bool isSymUpwardExposed = upwardExposedUses->Test(sym->m_id) || upwardExposedFields->Test(sym->m_id);
            if (!isSymUpwardExposed && symsInCallSequence.Test(sym->m_id))
            {
                // Don't remove/shrink sym-value pair if the sym is referenced in callSequence even if the sym is dead according to backward data flow.
                // This is possible in some edge cases that an infinite loop is involved when evaluating parameter for a function (between StartCall and Call),
                // there is no backward data flow into the infinite loop block, but non empty callSequence still populates to it in this (forward) pass
                // which causes error when looking up value for the syms in callSequence (cannot find the value).
                // It would cause error to fill out the bailout information for the loop blocks.
                // Remove dead syms from callSequence has some risk because there are various associated counters which need to be consistent.
                continue;
            }
            // Make sure symbol was created before backward pass.
            // If symbols isn't upward exposed, mark it as dead.
            // If a symbol was copy-prop'd in a loop prepass, the upwardExposedUses info could be wrong.  So wait until we are out of the loop before clearing it.
            bool isSymFieldPRESymStore = isInLoop && this->loop->fieldPRESymStores->Test(sym->m_id);
            if ((SymID)sym->m_id <= this->globOptData.globOpt->maxInitialSymID && !isSymUpwardExposed && !isSymFieldPRESymStore
                && (!isInLoop || !this->globOptData.globOpt->prePassCopyPropSym->Test(sym->m_id)))
            {
                Value *val = bucket.element;
                ValueInfo *valueInfo = val->GetValueInfo();

                Sym *symStore = valueInfo->GetSymStore();

                if (symStore && symStore == sym)
                {
                    // Keep constants around, as we don't know if there will be further uses
                    if (!bucket.element->GetValueInfo()->IsVarConstant() && !bucket.element->GetValueInfo()->HasIntConstantValue())
                    {
                        // Symbol may still be a copy-prop candidate.  Wait before deleting it.
                        deadSymsBv.Set(sym->m_id);

                        // Make sure the type sym is added to the dead syms vector as well, because type syms are
                        // created in backward pass and so their symIds > maxInitialSymID.
                        if (sym->IsStackSym() && sym->AsStackSym()->HasObjectTypeSym())
                        {
                            deadSymsBv.Set(sym->AsStackSym()->GetObjectTypeSym()->m_id);
                        }
                    }
                    availableValueNumbers.Set(val->GetValueNumber());
                }
                else
                {
                    // Make sure the type sym is added to the dead syms vector as well, because type syms are
                    // created in backward pass and so their symIds > maxInitialSymID. Perhaps we could remove
                    // it explicitly here, but would it work alright with the iterator?
                    if (sym->IsStackSym() && sym->AsStackSym()->HasObjectTypeSym())
                    {
                        deadSymsBv.Set(sym->AsStackSym()->GetObjectTypeSym()->m_id);
                    }

                    // Not a copy-prop candidate; delete it right away.
                    iter.RemoveCurrent(thisTable->alloc);
                    this->globOptData.liveInt32Syms->Clear(sym->m_id);
                    this->globOptData.liveLossyInt32Syms->Clear(sym->m_id);
                    this->globOptData.liveFloat64Syms->Clear(sym->m_id);
                    this->globOptData.SetChangedSym(sym);
                }
            }
            else
            {
                if (sym->IsPropertySym() && !this->globOptData.liveFields->Test(sym->m_id))
                {
                    // Remove propertySyms which are not live anymore.
                    iter.RemoveCurrent(thisTable->alloc);
                    this->globOptData.liveInt32Syms->Clear(sym->m_id);
                    this->globOptData.liveLossyInt32Syms->Clear(sym->m_id);
                    this->globOptData.liveFloat64Syms->Clear(sym->m_id);
                }
                else
                {
                    // Look at the copy-prop candidate. We don't want to get rid of the data for a symbol which is
                    // a copy-prop candidate.
                    Value *val = bucket.element;
                    ValueInfo *valueInfo = val->GetValueInfo();

                    Sym *symStore = valueInfo->GetSymStore();

                    if (symStore && symStore != sym)
                    {
                        keepAliveSymsBv.Set(symStore->m_id);
                        if (symStore->IsStackSym() && symStore->AsStackSym()->HasObjectTypeSym())
                        {
                            keepAliveSymsBv.Set(symStore->AsStackSym()->GetObjectTypeSym()->m_id);
                        }
                    }
                    availableValueNumbers.Set(val->GetValueNumber());
                }
            }
        } NEXT_SLISTBASE_ENTRY_EDITING;
    }

    deadSymsBv.Minus(&keepAliveSymsBv);

    // Now cleanup exprToValueMap table
    ExprHashTable *thisExprTable = this->globOptData.exprToValueMap;
    bool oldHasCSECandidatesValue = this->globOptData.hasCSECandidates;  // Could be false if none need bailout.
    this->globOptData.hasCSECandidates = false;

    for (uint i = 0; i < thisExprTable->tableSize; i++)
    {
        FOREACH_SLISTBASE_ENTRY_EDITING(ExprHashBucket, bucket, &thisExprTable->table[i], iter)
        {
            ExprHash hash = bucket.value;
            ValueNumber src1ValNum = hash.GetSrc1ValueNumber();
            ValueNumber src2ValNum = hash.GetSrc2ValueNumber();

            // If src1Val or src2Val are not available anymore, no point keeping this CSE candidate
            bool removeCurrent = false;
            if ((src1ValNum && !availableValueNumbers.Test(src1ValNum))
                || (src2ValNum && !availableValueNumbers.Test(src2ValNum)))
            {
                removeCurrent = true;
            }
            else
            {
                // If we are keeping this value, make sure we also keep the symStore in the value table
                removeCurrent = true; // Remove by default, unless it's set to false later below.
                Value *val = bucket.element;
                if (val)
                {
                    Sym *symStore = val->GetValueInfo()->GetSymStore();
                    if (symStore)
                    {
                        Value *symStoreVal = this->globOptData.FindValue(symStore);

                        if (symStoreVal && symStoreVal->GetValueNumber() == val->GetValueNumber())
                        {
                            removeCurrent = false;
                            deadSymsBv.Clear(symStore->m_id);
                            if (symStore->IsStackSym() && symStore->AsStackSym()->HasObjectTypeSym())
                            {
                                deadSymsBv.Clear(symStore->AsStackSym()->GetObjectTypeSym()->m_id);
                            }
                        }
                    }
                }
            }

            if(removeCurrent)
            {
                iter.RemoveCurrent(thisExprTable->alloc);
            }
            else
            {
                this->globOptData.hasCSECandidates = oldHasCSECandidatesValue;
            }
        } NEXT_SLISTBASE_ENTRY_EDITING;
    }

    FOREACH_BITSET_IN_SPARSEBV(dead_id, &deadSymsBv)
    {
        thisTable->Clear(dead_id);
        Sym* sym = this->func->m_symTable->Find(dead_id);
        this->globOptData.SetChangedSym(sym);
    }
    NEXT_BITSET_IN_SPARSEBV;

    if (!deadSymsBv.IsEmpty())
    {
        if (this->func->IsJitInDebugMode())
        {
            // Do not remove non-temp local vars from liveVarSyms (i.e. do not let them become dead).
            // We will need to restore all initialized/used so far non-temp local during bail out.
            // (See BackwardPass::ProcessBailOutInfo)
            Assert(this->func->m_nonTempLocalVars);
            BVSparse<JitArenaAllocator> tempBv(tempAlloc);
            tempBv.Minus(&deadSymsBv, this->func->m_nonTempLocalVars);
            this->globOptData.liveVarSyms->Minus(&tempBv);
#if DBG
            tempBv.And(this->globOptData.liveInt32Syms, this->func->m_nonTempLocalVars);
            AssertMsg(tempBv.IsEmpty(), "Type spec is disabled under debugger. How come did we get a non-temp local in liveInt32Syms?");
            tempBv.And(this->globOptData.liveLossyInt32Syms, this->func->m_nonTempLocalVars);
            AssertMsg(tempBv.IsEmpty(), "Type spec is disabled under debugger. How come did we get a non-temp local in liveLossyInt32Syms?");
            tempBv.And(this->globOptData.liveFloat64Syms, this->func->m_nonTempLocalVars);
            AssertMsg(tempBv.IsEmpty(), "Type spec is disabled under debugger. How come did we get a non-temp local in liveFloat64Syms?");
#endif
        }
        else
        {
            this->globOptData.liveVarSyms->Minus(&deadSymsBv);
        }

        this->globOptData.liveInt32Syms->Minus(&deadSymsBv);
        this->globOptData.liveLossyInt32Syms->Minus(&deadSymsBv);
        this->globOptData.liveFloat64Syms->Minus(&deadSymsBv);
    }

    JitAdelete(this->globOptData.globOpt->alloc, upwardExposedUses);
    this->upwardExposedUses = nullptr;
    JitAdelete(this->globOptData.globOpt->alloc, upwardExposedFields);
    this->upwardExposedFields = nullptr;
    if (this->cloneStrCandidates)
    {
        JitAdelete(this->globOptData.globOpt->alloc, this->cloneStrCandidates);
        this->cloneStrCandidates = nullptr;
    }
}